

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandNpnSave(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    Npn_ManSave(argv[globalUtilOptind]);
    iVar1 = 0;
  }
  else {
    Abc_Print(-2,"usage: npnsave <filename>\n");
    Abc_Print(-2,"\t         saves current 6-input function library into file\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandNpnSave( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Npn_ManSave( char * pFileName );
    char * pFileName;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    pFileName = argv[globalUtilOptind];
    Npn_ManSave( pFileName );
    return 0;

usage:
    Abc_Print( -2, "usage: npnsave <filename>\n" );
    Abc_Print( -2, "\t         saves current 6-input function library into file\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}